

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  byte bVar1;
  Curl_cwriter_phase phase;
  int iVar2;
  CURLcode CVar3;
  ulong uVar4;
  size_t sVar5;
  byte *pbVar6;
  size_t max;
  Curl_cwtype **ppCVar7;
  Curl_cwtype *ce;
  Curl_cwtype *cwt;
  Curl_cwriter *writer;
  
  phase = (uint)(is_transfer == 0) * 2 + CURL_CW_TRANSFER_DECODE;
LAB_0012a7fe:
  while ((uVar4 = (ulong)(byte)*enclist, uVar4 < 0x2d &&
         ((0x100100000200U >> (uVar4 & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  sVar5 = 1;
  max = 0;
  pbVar6 = (byte *)enclist;
  do {
    bVar1 = (byte)uVar4;
    if ((bVar1 != 9) && (iVar2 = (int)uVar4, iVar2 != 0x20)) {
      if ((iVar2 == 0) || (iVar2 == 0x2c)) break;
      if (3 < (byte)(bVar1 - 10)) {
        max = sVar5;
      }
    }
    uVar4 = (ulong)pbVar6[1];
    pbVar6 = pbVar6 + 1;
    sVar5 = sVar5 + 1;
  } while( true );
  if (max != 0) {
    uVar4 = *(ulong *)&(data->set).field_0x8ba;
    if (is_transfer == 0) {
      if ((uVar4 >> 0x24 & 1) != 0) {
        return CURLE_OK;
      }
    }
    else if (((uint)uVar4 >> 0x16 & 1) == 0) {
      if (max != 7) {
        return CURLE_OK;
      }
      iVar2 = curl_strnequal(enclist,"chunked",7);
      if (iVar2 == 0) {
        return CURLE_OK;
      }
    }
    sVar5 = Curl_cwriter_count(data,phase);
    if (sVar5 - 4 < 0xfffffffffffffffb) {
      Curl_failf(data,"Reject response due to more than %u content encodings",5);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    if (is_transfer != 0) {
      for (ppCVar7 = transfer_unencoders; cwt = *ppCVar7, cwt != (Curl_cwtype *)0x0;
          ppCVar7 = ppCVar7 + 1) {
        iVar2 = curl_strnequal(enclist,cwt->name,max);
        if (((iVar2 != 0) && (cwt->name[max] == '\0')) ||
           ((cwt->alias != (char *)0x0 &&
            ((iVar2 = curl_strnequal(enclist,cwt->alias,max), iVar2 != 0 &&
             (cwt->alias[max] == '\0')))))) goto LAB_0012a963;
      }
    }
    for (ppCVar7 = general_unencoders; cwt = *ppCVar7, cwt != (Curl_cwtype *)0x0;
        ppCVar7 = ppCVar7 + 1) {
      iVar2 = curl_strnequal(enclist,cwt->name,max);
      if (((iVar2 != 0) && (cwt->name[max] == '\0')) ||
         ((cwt->alias != (char *)0x0 &&
          ((iVar2 = curl_strnequal(enclist,cwt->alias,max), iVar2 != 0 && (cwt->alias[max] == '\0'))
          )))) goto LAB_0012a963;
    }
    cwt = (Curl_cwtype *)0x0;
LAB_0012a963:
    if (cwt == (Curl_cwtype *)0x0) {
      cwt = &error_writer;
    }
    CVar3 = Curl_cwriter_create(&writer,data,cwt,phase);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_cwriter_add(data,writer);
    if (CVar3 != CURLE_OK) {
      Curl_cwriter_free(data,writer);
      return CVar3;
    }
    bVar1 = *pbVar6;
  }
  enclist = (char *)pbVar6;
  if (bVar1 == 0) {
    return CURLE_OK;
  }
  goto LAB_0012a7fe;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer?
                             CURL_CW_TRANSFER_DECODE:CURL_CW_CONTENT_DECODE;
  CURLcode result;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding &&
          (namelen != 7 || !strncasecompare(name, "chunked", 7))) ||
         (!is_transfer && data->set.http_ce_skip)) {
        /* not requested, ignore */
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
    }
  } while(*enclist);

  return CURLE_OK;
}